

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O1

void fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t acc;
  fe_t t82;
  fe_t t2;
  fe_t t16;
  fe_t t8;
  fe_t t4;
  fe_t t32;
  fe_t t80;
  fe_t t64;
  fe_t t246;
  fe_t t164;
  uint64_t auStack_238 [6];
  uint64_t local_208 [6];
  uint64_t local_1d8 [6];
  uint64_t local_1a8 [6];
  uint64_t local_178 [6];
  uint64_t local_148 [6];
  uint64_t local_118 [6];
  uint64_t local_e8 [6];
  uint64_t local_b8 [6];
  uint64_t local_88 [6];
  uint64_t local_58 [5];
  
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,t1);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_1d8,auStack_238,t1);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_1d8);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_148,auStack_238,local_1d8);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_148);
  iVar1 = 3;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_178,auStack_238,local_148);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_178);
  iVar1 = 7;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_1a8,auStack_238,local_178);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_1a8);
  iVar1 = 0xf;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_118,auStack_238,local_1a8);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_118);
  iVar1 = 0x1f;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_b8,auStack_238,local_118);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_b8);
  iVar1 = 0xf;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_e8,auStack_238,local_1a8);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_e8);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_208,auStack_238,local_1d8);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_208);
  iVar1 = 0x51;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_58,auStack_238,local_208);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_58);
  iVar1 = 0x51;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_88,auStack_238,local_208);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,local_88);
  iVar1 = 1;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(auStack_238,auStack_238,local_1d8);
  iVar1 = 3;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(auStack_238,auStack_238,t1);
  iVar1 = 1;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(auStack_238,auStack_238,t1);
  iVar1 = 1;
  do {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(output,auStack_238,t1);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(fe_t output,
                                                          const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t16, t164, t2, t246, t32, t4, t64, t8, t80, t82;

    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t2, acc, t1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t4, acc, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t4);
    for (i = 0; i < 3; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t8, acc, t4);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t8);
    for (i = 0; i < 7; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t16, acc, t8);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t16);
    for (i = 0; i < 15; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t32, acc, t16);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t32);
    for (i = 0; i < 31; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t64, acc, t32);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t64);
    for (i = 0; i < 15; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t80, acc, t16);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t80);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t82, acc, t2);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t82);
    for (i = 0; i < 81; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t164, acc, t82);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t164);
    for (i = 0; i < 81; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(t246, acc, t82);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, t246);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(acc, acc, t2);
    for (i = 0; i < 3; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(acc, acc, t1);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(acc, acc, t1);
    for (i = 0; i < 2; i++)
        fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_square(acc, acc);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(output, acc, t1);
}